

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

ssize_t __thiscall
duckdb_parquet::ColumnCryptoMetaData::write
          (ColumnCryptoMetaData *this,int __fd,void *__buf,size_t __n)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  ssize_t sVar4;
  void *__buf_00;
  void *__buf_01;
  TOutputRecursionTracker tracker;
  uint32_t xfer;
  TProtocol *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint32_t local_14;
  
  duckdb_apache::thrift::protocol::TOutputRecursionTracker::TOutputRecursionTracker
            ((TOutputRecursionTracker *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98
            );
  local_14 = duckdb_apache::thrift::protocol::TProtocol::writeStructBegin
                       ((TProtocol *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        (char *)in_stack_ffffffffffffff98);
  if (((byte)this->__isset & 1) != 0) {
    uVar1 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                      ((TProtocol *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       (char *)in_stack_ffffffffffffff98,T_STOP,0x71);
    sVar4 = EncryptionWithFooterKey::write
                      (&this->ENCRYPTION_WITH_FOOTER_KEY,__fd,__buf_00,(ulong)uVar1);
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x7130e4);
    local_14 = uVar2 + local_14 + uVar1 + (int)sVar4;
  }
  if (((byte)this->__isset >> 1 & 1) != 0) {
    uVar1 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                      ((TProtocol *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       (char *)in_stack_ffffffffffffff98,T_STOP,0x71);
    sVar4 = EncryptionWithColumnKey::write
                      (&this->ENCRYPTION_WITH_COLUMN_KEY,__fd,__buf_01,(ulong)uVar1);
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x713185);
    local_14 = uVar2 + local_14 + uVar1 + (int)sVar4;
  }
  uVar1 = duckdb_apache::thrift::protocol::TProtocol::writeFieldStop((TProtocol *)0x7131a1);
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeStructEnd((TProtocol *)0x7131bf);
  uVar3 = uVar2 + local_14 + uVar1;
  duckdb_apache::thrift::protocol::TOutputRecursionTracker::~TOutputRecursionTracker
            ((TOutputRecursionTracker *)0x7131e3);
  return (ulong)uVar3;
}

Assistant:

uint32_t ColumnCryptoMetaData::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("ColumnCryptoMetaData");

  if (this->__isset.ENCRYPTION_WITH_FOOTER_KEY) {
    xfer += oprot->writeFieldBegin("ENCRYPTION_WITH_FOOTER_KEY", ::apache::thrift::protocol::T_STRUCT, 1);
    xfer += this->ENCRYPTION_WITH_FOOTER_KEY.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.ENCRYPTION_WITH_COLUMN_KEY) {
    xfer += oprot->writeFieldBegin("ENCRYPTION_WITH_COLUMN_KEY", ::apache::thrift::protocol::T_STRUCT, 2);
    xfer += this->ENCRYPTION_WITH_COLUMN_KEY.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}